

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O3

int AF_A_WraithChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  byte bVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  uint uVar7;
  VMValue *pVVar8;
  char *__assertion;
  AActor *self;
  bool bVar9;
  bool bVar10;
  double dVar11;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ec9da;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_005ec887:
        self = (AActor *)0x0;
        pVVar8 = param;
        uVar7 = numparam;
      }
      else {
        pPVar6 = (self->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (self->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar9 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar6 == pPVar4;
        if (!bVar10 && !bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar7 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ec9da;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005ec94f;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005ec9ca;
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar3[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar8,uVar7,ret);
              puVar3[1] = pPVar6;
            }
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar4 && bVar9) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar9 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar4) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005ec9da;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_005ec9ca;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ec94f:
        bVar2 = self->WeaveIndexZ;
        dVar11 = FFastTrig::sin(&fasttrig,
                                (double)bVar2 * 5.625 * 11930464.711111112 + 6755399441055744.0);
        (self->__Pos).Z = dVar11 * 8.0 + (self->__Pos).Z;
        self->WeaveIndexZ = bVar2 + 2 & 0x3f;
        A_Chase(stack,self);
        A_WraithFX4(self);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005ec9da;
    }
    if (self == (AActor *)0x0) goto LAB_005ec887;
  }
LAB_005ec9ca:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005ec9da:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0xf5,"int AF_A_WraithChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithChase)
{
	PARAM_ACTION_PROLOGUE;

	int weaveindex = self->WeaveIndexZ;
	self->AddZ(BobSin(weaveindex));
	self->WeaveIndexZ = (weaveindex + 2) & 63;
//	if (self->Floorclip > 0)
//	{
//		P_SetMobjState(self, S_WRAITH_RAISE2);
//		return;
//	}
	A_Chase (stack, self);
	A_WraithFX4 (self);
	return 0;
}